

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  bool bVar5;
  ImGuiContext *pIVar6;
  uint uVar7;
  ImU32 col;
  ImU32 col_00;
  float *pfVar8;
  ImGuiCol idx;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar9;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool held;
  bool hovered;
  float local_ec;
  ImRect local_e8;
  float local_cc;
  float *local_c8;
  ImDrawCornerFlags local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  auVar21._4_60_ = in_register_00001244;
  auVar21._0_4_ = size_contents_v;
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = size_avail_v;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    local_b8 = auVar21._0_16_;
    local_88 = auVar15._0_16_;
    auVar11._8_8_ = 0;
    auVar11._0_4_ = (bb_frame->Min).x;
    auVar11._4_4_ = (bb_frame->Min).y;
    auVar16._8_8_ = 0;
    auVar16._0_4_ = (bb_frame->Max).x;
    auVar16._4_4_ = (bb_frame->Max).y;
    auVar11 = vsubps_avx(auVar16,auVar11);
    held = false;
    if (0.0 < auVar11._0_4_) {
      auVar16 = vmovshdup_avx(auVar11);
      fVar9 = auVar16._0_4_;
      if (0.0 < fVar9) {
        local_ec = 1.0;
        if (axis == ImGuiAxis_Y) {
          fVar1 = (GImGui->Style).FramePadding.y;
          fVar1 = fVar1 + fVar1;
          if (fVar9 < fVar1 + GImGui->FontSize) {
            auVar20._0_4_ = (fVar9 - GImGui->FontSize) / fVar1;
            auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
            if (auVar20._0_4_ < 0.0) {
              return false;
            }
            auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
            local_ec = auVar16._0_4_;
            if (local_ec <= 0.0) {
              return false;
            }
          }
        }
        auVar4._0_4_ = (bb_frame->Min).x;
        auVar4._4_4_ = (bb_frame->Min).y;
        auVar4._8_4_ = (bb_frame->Max).x;
        local_e8.Max.y = (bb_frame->Max).y;
        auVar10._0_4_ = (int)((auVar11._0_4_ + -2.0) * 0.5);
        auVar10._4_4_ = (int)((auVar11._4_4_ + -2.0) * 0.5);
        auVar10._8_4_ = (int)((auVar11._8_4_ + -2.0) * 0.5);
        auVar10._12_4_ = (int)((auVar11._12_4_ + -2.0) * 0.5);
        auVar11 = vcvtdq2ps_avx(auVar10);
        auVar22._8_4_ = 3;
        auVar22._0_8_ = 0x300000003;
        auVar22._12_4_ = 3;
        auVar16 = vpcmpgtd_avx(auVar10,auVar22);
        auVar23._8_4_ = 0x80000000;
        auVar23._0_8_ = 0x8000000080000000;
        auVar23._12_4_ = 0x80000000;
        auVar17._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
        auVar17._8_4_ = auVar11._8_4_ ^ 0x80000000;
        auVar17._12_4_ = auVar11._12_4_ ^ 0x80000000;
        auVar24._8_4_ = 0xc0400000;
        auVar24._0_8_ = 0xc0400000c0400000;
        auVar24._12_4_ = 0xc0400000;
        auVar11 = vblendvps_avx(auVar17,auVar24,auVar16);
        auVar11 = vblendvps_avx(auVar11,auVar23,auVar10);
        auVar18._8_8_ = auVar11._0_8_;
        auVar18._0_8_ = auVar11._0_8_;
        auVar3._12_4_ = local_e8.Max.y;
        auVar3._0_12_ = auVar4;
        auVar16 = vsubps_avx(auVar3,auVar18);
        auVar19._0_4_ = (float)auVar4._0_4_ + auVar11._0_4_;
        auVar19._4_4_ = (float)auVar4._4_4_ + auVar11._4_4_;
        auVar19._8_4_ = (float)auVar4._8_4_ + auVar11._0_4_;
        auVar19._12_4_ = local_e8.Max.y + auVar11._4_4_;
        local_e8.Min.x = auVar16._0_4_;
        local_e8.Min.y = auVar16._4_4_;
        auVar11 = vshufpd_avx(auVar19,auVar19,1);
        if (axis == ImGuiAxis_X) {
          local_a8 = ZEXT416((uint)(auVar11._0_4_ - local_e8.Min.x));
        }
        else {
          auVar11 = vsubps_avx(auVar11,auVar16);
          local_a8 = vmovshdup_avx(auVar11);
        }
        auVar11 = vcmpss_avx(local_88,local_b8,2);
        auVar11 = vblendvps_avx(local_88,local_b8,auVar11);
        local_e8.Max.x = auVar19._8_4_;
        local_e8.Max.y = auVar19._12_4_;
        local_c8 = p_scroll_v;
        if (auVar11._0_4_ <= 0.0) {
          __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                        ,0x3a4,
                        "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                       );
        }
        auVar11 = vmaxss_avx(auVar11,ZEXT416(0x3f800000));
        auVar11 = ZEXT416((uint)((size_avail_v / auVar11._0_4_) * local_a8._0_4_));
        auVar16 = vminss_avx(local_a8,auVar11);
        auVar20 = ZEXT416((uint)(GImGui->Style).GrabMinSize);
        auVar11 = vcmpss_avx(auVar11,auVar20,1);
        local_78 = vblendvps_avx(auVar16,auVar20,auVar11);
        held = false;
        hovered = false;
        ButtonBehavior(&local_e8,id,&hovered,&held,0x40000);
        auVar11 = vinsertps_avx(local_78,ZEXT416((uint)*local_c8),0x1c);
        auVar20 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),
                             ZEXT416((uint)((float)local_b8._0_4_ - (float)local_88._0_4_)));
        auVar16 = vinsertps_avx(local_a8,auVar20,0x10);
        auVar16 = vdivps_avx(auVar11,auVar16);
        auVar11 = vcmpps_avx(auVar16,SUB6416(ZEXT464(0x3f800000),0),1);
        auVar11 = vshufps_avx(auVar11,auVar11,0x50);
        uVar7 = vmovmskpd_avx(auVar11);
        fVar9 = 0.0;
        if ((uVar7 & 2) == 0) {
          auVar11 = vmovshdup_avx(auVar16);
          auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
          fVar9 = auVar11._0_4_;
        }
        fVar1 = local_a8._0_4_ - local_78._0_4_;
        fVar9 = (fVar1 * fVar9) / local_a8._0_4_;
        local_88._0_8_ = &bb_frame->Max;
        local_bc = rounding_corners;
        local_b8._0_4_ = fVar9;
        if (((1.0 <= local_ec) && ((uVar7 & 1) != 0)) && (held != false)) {
          local_cc = fVar1;
          local_68 = auVar20;
          local_58 = auVar16;
          pfVar8 = ImVec2::operator[](&local_e8.Min,(long)axis);
          local_98._0_4_ = *pfVar8;
          pfVar8 = ImVec2::operator[](&(pIVar6->IO).MousePos,(long)axis);
          auVar12._0_4_ = (*pfVar8 - (float)local_98._0_4_) / (float)local_a8._0_4_;
          auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
          auVar11 = vcmpss_avx(auVar12,ZEXT816(0) << 0x40,1);
          local_98 = vandnps_avx(auVar11,auVar16);
          SetHoveredID(id);
          if (pIVar6->ActiveIdIsJustActivated == false) {
            fVar9 = pIVar6->ScrollbarClickDeltaToGrabCenter;
            bVar5 = false;
          }
          else if (((float)local_98._0_4_ < (float)local_b8._0_4_) ||
                  ((float)local_58._0_4_ + (float)local_b8._0_4_ < (float)local_98._0_4_)) {
            pIVar6->ScrollbarClickDeltaToGrabCenter = 0.0;
            bVar5 = true;
            fVar9 = 0.0;
          }
          else {
            fVar9 = ((float)local_98._0_4_ - (float)local_b8._0_4_) + (float)local_58._0_4_ * -0.5;
            pIVar6->ScrollbarClickDeltaToGrabCenter = fVar9;
            bVar5 = false;
          }
          auVar13._0_4_ =
               (((float)local_98._0_4_ - fVar9) - (float)local_58._0_4_ * 0.5) /
               (1.0 - (float)local_58._0_4_);
          auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar13);
          auVar11 = vcmpss_avx(auVar13,ZEXT816(0) << 0x40,1);
          auVar11 = vandnps_avx(auVar11,auVar16);
          auVar11 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar11._0_4_ * (float)local_68._0_4_ + 0.5)))
          ;
          *local_c8 = auVar11._0_4_;
          auVar14._0_4_ = auVar11._0_4_ / (float)local_68._0_4_;
          auVar14._4_12_ = auVar11._4_12_;
          auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
          auVar11 = vcmpss_avx(auVar14,ZEXT816(0) << 0x40,1);
          auVar11 = vandnps_avx(auVar11,auVar16);
          local_b8._0_4_ = (local_cc * auVar11._0_4_) / (float)local_a8._0_4_;
          if (bVar5) {
            pIVar6->ScrollbarClickDeltaToGrabCenter =
                 -(float)local_58._0_4_ * 0.5 + ((float)local_98._0_4_ - (float)local_b8._0_4_);
          }
        }
        col = GetColorU32(0xe,1.0);
        idx = 0x11;
        if (held == false) {
          idx = (hovered & 1) + 0xf;
        }
        col_00 = GetColorU32(idx,local_ec);
        ImDrawList::AddRectFilled
                  (pIVar2->DrawList,&bb_frame->Min,(ImVec2 *)local_88._0_8_,col,
                   pIVar2->WindowRounding,local_bc);
        if (axis == ImGuiAxis_X) {
          local_40.x = (local_e8.Max.x - local_e8.Min.x) * (float)local_b8._0_4_ + local_e8.Min.x;
          local_38.x = local_40.x + (float)local_78._0_4_;
          local_40.y = local_e8.Min.y;
          local_38.y = local_e8.Max.y;
        }
        else {
          local_40.y = (local_e8.Max.y - local_e8.Min.y) * (float)local_b8._0_4_ + local_e8.Min.y;
          local_40.x = local_e8.Min.x;
          local_38.x = local_e8.Max.x;
          local_38.y = local_40.y + (float)local_78._0_4_;
        }
        ImDrawList::AddRectFilled
                  (pIVar2->DrawList,&local_40,&local_38,col_00,(pIVar6->Style).ScrollbarRounding,0xf
                  );
      }
    }
  }
  else {
    held = false;
  }
  return held;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}